

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::SetBbrDataset
          (CommissionerImpl *this,ErrorHandler *aHandler,BbrDataset *aDataset)

{
  char cVar1;
  ErrorCode EVar2;
  int iVar3;
  Error *pEVar4;
  function<void_(ot::commissioner::Error)> *this_00;
  char *pcVar5;
  char *pcVar6;
  string *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  writer write;
  string local_1c8;
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  parse_func local_180 [1];
  undefined1 local_178 [8];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_170;
  Error error;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_e0 [40];
  Request request;
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  coap::Message::Message(&request,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function(&onResponse.aHandler,aHandler);
  iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
  if ((char)iVar3 == '\0') {
    local_1a8._0_4_ = none_type;
    local_1a0._M_p = "the commissioner is not active";
    local_198 = 0x1e;
    local_190._M_allocated_capacity = 0;
    local_180[0] = (parse_func)0x0;
    pcVar5 = "the commissioner is not active";
    local_190._8_8_ = (format_string_checker<char> *)local_1a8;
    while (pcVar6 = pcVar5, pcVar6 != "") {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_1a8);
      }
    }
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_1a8;
    ::fmt::v10::vformat_abi_cxx11_(&local_1c8,(v10 *)0x1f85d8,(string_view)ZEXT816(0x1e),args);
    local_178._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)&local_170,(string *)&local_1c8);
LAB_00174aef:
    Error::operator=(&error,(Error *)local_178);
    std::__cxx11::string::~string((string *)&local_170);
    this_01 = &local_1c8;
  }
  else {
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 == '\0') {
      local_1a8._0_4_ = none_type;
      local_1a0._M_p = "sending MGMT_BBR_SET.req is only valid in CCM mode";
      local_198 = 0x32;
      local_190._M_allocated_capacity = 0;
      local_180[0] = (parse_func)0x0;
      pcVar5 = "sending MGMT_BBR_SET.req is only valid in CCM mode";
      write.handler_ = (format_string_checker<char> *)local_1a8;
      local_190._8_8_ = (format_string_checker<char> *)local_1a8;
      while (pcVar5 != "") {
        cVar1 = *pcVar5;
        pcVar6 = pcVar5;
        while (cVar1 != '{') {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&write,pcVar5,"");
            goto LAB_001749ef;
          }
          cVar1 = *pcVar6;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&write,pcVar5,pcVar6);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_1a8);
      }
LAB_001749ef:
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_1a8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_1c8,(v10 *)"sending MGMT_BBR_SET.req is only valid in CCM mode",
                 (string_view)ZEXT816(0x32),args_00);
      local_178._0_4_ = kInvalidState;
      std::__cxx11::string::string((string *)&local_170,(string *)&local_1c8);
      goto LAB_00174aef;
    }
    if ((aDataset->mPresentFlags & 0x2000) != 0) {
      local_1a8._0_4_ = none_type;
      local_1a0._M_p = "trying to set Registrar IPv6 Address which is read-only";
      local_198 = 0x37;
      local_190._M_allocated_capacity = 0;
      local_180[0] = (parse_func)0x0;
      pcVar5 = "trying to set Registrar IPv6 Address which is read-only";
      write.handler_ = (format_string_checker<char> *)local_1a8;
      local_190._8_8_ = (format_string_checker<char> *)local_1a8;
      while (pcVar5 != "") {
        cVar1 = *pcVar5;
        pcVar6 = pcVar5;
        while (cVar1 != '{') {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&write,pcVar5,"");
            goto LAB_00174aba;
          }
          cVar1 = *pcVar6;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&write,pcVar5,pcVar6);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_1a8);
      }
LAB_00174aba:
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_1a8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_1c8,(v10 *)"trying to set Registrar IPv6 Address which is read-only",
                 (string_view)ZEXT816(0x37),args_01);
      local_178._0_4_ = kInvalidArgs;
      std::__cxx11::string::string((string *)&local_170,(string *)&local_1c8);
      goto LAB_00174aef;
    }
    std::__cxx11::string::string((string *)local_178,"/c/bs",(allocator *)&local_1c8);
    coap::Message::SetUriPath((Error *)local_1a8,&request,(string *)local_178);
    pEVar4 = Error::operator=(&error,(Error *)local_1a8);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)local_178);
    if (EVar2 != kNone) goto LAB_00174b13;
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[7])(this);
    tlv::Tlv::Tlv((Tlv *)local_178,kCommissionerSessionId,(uint16_t)iVar3,kMeshCoP);
    AppendTlv((Error *)local_1a8,&request,(Tlv *)local_178);
    pEVar4 = Error::operator=(&error,(Error *)local_1a8);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&local_1a0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_170);
    if (EVar2 != kNone) goto LAB_00174b13;
    EncodeBbrDataset((Error *)local_1a8,&request,aDataset);
    pEVar4 = Error::operator=(&error,(Error *)local_1a8);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&local_1a0);
    if (EVar2 != kNone) goto LAB_00174b13;
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 != '\0') {
      SignRequest((Error *)local_1a8,this,&request,kMeshCoP,true);
      pEVar4 = Error::operator=(&error,(Error *)local_1a8);
      EVar2 = pEVar4->mCode;
      std::__cxx11::string::~string((string *)&local_1a0);
      if (EVar2 != kNone) goto LAB_00174b13;
    }
    local_118 = (code *)0x0;
    pcStack_110 = (code *)0x0;
    local_128._M_unused._M_object = (void *)0x0;
    local_128._8_8_ = 0;
    this_00 = (function<void_(ot::commissioner::Error)> *)operator_new(0x20);
    std::function<void_(ot::commissioner::Error)>::function(this_00,&onResponse.aHandler);
    pcStack_110 = std::
                  _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:788:23)>
                  ::_M_invoke;
    local_118 = std::
                _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:788:23)>
                ::_M_manager;
    local_128._M_unused._M_object = this_00;
    ProxyClient::SendRequest
              (&this->mProxyClient,&request,(ResponseHandler *)&local_128,0xfc00,0xf0bf);
    std::_Function_base::~_Function_base((_Function_base *)&local_128);
    std::__cxx11::string::string((string *)local_178,"mgmt",(allocator *)&write);
    local_1a8._0_4_ = none_type;
    local_1a0._M_p = "sent MGMT_BBR_SET.req";
    local_198 = 0x15;
    local_190._M_allocated_capacity = 0;
    local_180[0] = (parse_func)0x0;
    pcVar5 = "sent MGMT_BBR_SET.req";
    local_190._8_8_ = (format_string_checker<char> *)local_1a8;
    while (pcVar6 = pcVar5, pcVar6 != "") {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_1a8);
      }
    }
    args_02.field_1.args_ = in_R9.args_;
    args_02.desc_ = (unsigned_long_long)local_1a8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_1c8,(v10 *)"sent MGMT_BBR_SET.req",(string_view)ZEXT816(0x15),args_02);
    Log(kDebug,(string *)local_178,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    this_01 = (string *)local_178;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_00174b13:
  if (error.mCode != kNone) {
    Error::Error((Error *)local_e0,&error);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,(Error *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
  }
  std::_Function_base::~_Function_base((_Function_base *)&onResponse);
  coap::Message::~Message(&request);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void CommissionerImpl::SetBbrDataset(ErrorHandler aHandler, const BbrDataset &aDataset)
{
    Error error;

    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        aHandler(HandleStateResponse(aResponse, aError));
    };

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    VerifyOrExit(IsCcmMode(), error = ERROR_INVALID_STATE("sending MGMT_BBR_SET.req is only valid in CCM mode"));
    VerifyOrExit((aDataset.mPresentFlags & BbrDataset::kRegistrarIpv6AddrBit) == 0,
                 error = ERROR_INVALID_ARGS("trying to set Registrar IPv6 Address which is read-only"));

    SuccessOrExit(error = request.SetUriPath(uri::kMgmtBbrSet));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));
    SuccessOrExit(error = EncodeBbrDataset(request, aDataset));

    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }

    mProxyClient.SendRequest(request, onResponse, kLeaderAloc16, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_BBR_SET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}